

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

int run_test_poll_bad_fdtype(void)

{
  int iVar1;
  uv_os_fd_t uVar2;
  int iVar3;
  undefined8 uVar4;
  uv_loop_t *loop;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int fd;
  uv_os_fd_t handle;
  uv_poll_t poll_handle;
  
  iVar1 = open64(".",0);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x287,"fd","!=","-1",0xffffffffffffffff,"!=",0xffffffffffffffff);
    abort();
  }
  uVar2 = uv_get_osfhandle(iVar1);
  uVar4 = uv_default_loop();
  iVar3 = uv_poll_init(uVar4,&fd,uVar2);
  if (iVar3 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x28a,"0","!=","uv_poll_init(uv_default_loop(), &poll_handle, (uv_os_sock_t) handle)",0
            ,"!=",0);
    abort();
  }
  iVar1 = close(iVar1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x28b,"close(fd)","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar4 = uv_default_loop();
  iVar1 = uv_loop_close(uVar4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x28e,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(poll_bad_fdtype) {
#if !defined(__DragonFly__) && !defined(__FreeBSD__) && !defined(__sun) && \
    !defined(_AIX) && !defined(__MVS__) && \
    !defined(__OpenBSD__) && !defined(__CYGWIN__) && !defined(__MSYS__) && \
    !defined(__NetBSD__)
  uv_poll_t poll_handle;
  uv_os_fd_t handle;
  int fd;

#if defined(_WIN32)
  fd = _open("test/fixtures/empty_file", UV_FS_O_RDONLY);
#else
  fd = open(".", UV_FS_O_RDONLY);
#endif
  ASSERT_NE(fd, -1);
  handle = uv_get_osfhandle(fd);
  /* This uses a bad cast on windows to allow passing an invalid SOCKET. */
  ASSERT_NE(0, uv_poll_init(uv_default_loop(), &poll_handle, (uv_os_sock_t) handle));
  ASSERT_OK(close(fd));
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}